

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O2

void ParseUsbPortBlock(USBPortBlock_t *dblock)

{
  int *piVar1;
  int i;
  long lVar2;
  
  puts("   COM-HPC USB Port block:");
  printf("      Port %d: Generation: %s\n",(ulong)dblock->PortNr,
         &DAT_00104114 + *(int *)(&DAT_00104114 + (ulong)(dblock->UsbGeneration & 7) * 4));
  if ((dblock->UsbGeneration >> 4 & 7) != 0) {
    printf("      Paired with port %d\n");
  }
  printf("      Supported features: ");
  piVar1 = &DAT_0010412c;
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    if ((dblock->Flags >> ((uint)lVar2 & 0x1f) & 1) != 0) {
      printf("%s ",(long)&DAT_0010412c + (long)*piVar1);
    }
    piVar1 = piVar1 + 1;
  }
  putchar(10);
  return;
}

Assistant:

void ParseUsbPortBlock(USBPortBlock_t *dblock)
{
    const char *generations[] =
        { "USB 2.0", "USB 3.2 Gen 1", "USB 3.2 Gen 2", "USB 3.2 Gen 2x2", "USB 4.0 Gen 2x2", "USB 4.0 Gen 3x2" };
    const char *flags[] =
        { "DisplayPort", "PCIe", "USB-C-Connector", "USB-C-LaneMuxing", "Port80", "ClientMode" };
	printf("   COM-HPC USB Port block:\n");
	printf("      Port %d: Generation: %s\n", dblock->PortNr, generations[dblock->UsbGeneration & 7] );
    if((dblock->UsbGeneration >> 4) & 7) {
        printf("      Paired with port %d\n", (dblock->UsbGeneration >> 4) & 7);
    }
    printf("      Supported features: ");
    for(int i = 0; i < 6; i++) {
        if(dblock->Flags & (1 << i)) {
            printf("%s ", flags[i]);
        }
    }
    printf("\n");
}